

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_alloc_strategy.hpp
# Opt level: O2

void __thiscall foxxll::fully_random::fully_random(fully_random *this)

{
  ulong uVar1;
  int iVar2;
  random_device rStack_1398;
  
  striping::striping(&this->super_striping);
  std::random_device::random_device(&rStack_1398);
  uVar1 = std::random_device::_M_getval();
  iVar2 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  (this->rng_)._M_x = (ulong)(iVar2 + (uint)(iVar2 == 0));
  std::random_device::~random_device(&rStack_1398);
  return;
}

Assistant:

fully_random() : striping() { }